

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O1

usize __thiscall Console::Prompt::Private::readBufferedChar(Private *this,char *buffer)

{
  usize *puVar1;
  code *pcVar2;
  int iVar3;
  byte *pbVar4;
  usize uVar5;
  ssize_t sVar6;
  usize *puVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  
  pbVar4 = (this->bufferedInput).bufferStart;
  if (pbVar4 == (this->bufferedInput).bufferEnd) {
    sVar6 = read(0,buffer,1);
    if (sVar6 != 1) {
      iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                            ,0x45e,"read(STDIN_FILENO, buffer, 1) == 1",in_R8,in_R9,pbVar4);
      if (iVar3 != 0) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    if (*buffer == '\x1b') {
      uVar5 = readUnbufferedEscapedSequence(this,buffer,buffer + 1);
      uVar5 = uVar5 + 1;
    }
    else {
      buffer[1] = '\0';
      uVar5 = 1;
    }
    return uVar5;
  }
  *buffer = *pbVar4;
  pbVar4 = (this->bufferedInput).bufferStart + 1;
  (this->bufferedInput).bufferStart = pbVar4;
  if ((this->bufferedInput).bufferEnd <= pbVar4) {
    puVar1 = (usize *)(this->bufferedInput).buffer;
    puVar7 = &(this->bufferedInput)._capacity;
    if (puVar1 != (usize *)0x0) {
      puVar7 = puVar1;
    }
    (this->bufferedInput).bufferEnd = (byte *)puVar7;
    (this->bufferedInput).bufferStart = (byte *)puVar7;
  }
  if (*buffer == '\x1b') {
    uVar5 = readBufferedEscapedSequence(this,buffer,buffer + 1);
    return uVar5 + 1;
  }
  buffer[1] = '\0';
  return 1;
}

Assistant:

bool isEmpty() const {return bufferStart == bufferEnd;}